

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkPerModifications(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  size_t __pos;
  char *__s;
  size_type __n2;
  precise_unit pVar2;
  string local_70;
  string local_50;
  
  if (((uint)match_flags >> 0x15 & 1) == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"per","");
    __pos = findWordOperatorSep(unit_string,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (__pos != 0xffffffffffffffff) {
      if (__pos == 0) {
        __s = "1/";
        __n2 = 2;
        __pos = 0;
      }
      else {
        __s = "/";
        __n2 = 1;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 __pos,3,__s,__n2);
      pcVar1 = (unit_string->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + unit_string->_M_string_length);
      pVar2 = unit_from_string_internal(&local_70,match_flags + 0x80000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((pVar2._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar2.multiplier_)) {
        return pVar2;
      }
    }
  }
  pVar2.base_units_ = (unit_data)0xfa94a488;
  pVar2.commodity_ = 0;
  pVar2.multiplier_ = NAN;
  return pVar2;
}

Assistant:

static precise_unit
    checkPerModifications(std::string unit_string, std::uint64_t match_flags)
{
    // try changing out any "per" words for division sign
    if ((match_flags & no_per_operators) == 0) {
        auto fnd = findWordOperatorSep(unit_string, "per");
        if (fnd != std::string::npos) {
            if (fnd == 0) {
                unit_string.replace(fnd, 3, "1/");
            } else {
                unit_string.replace(fnd, 3, "/");
            }
            auto retunit = unit_from_string_internal(
                unit_string, match_flags + per_operator1);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}